

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_iterate64
                (run_container_t *cont,uint32_t base,roaring_iterator64 iterator,uint64_t high_bits,
                void *ptr)

{
  ushort uVar1;
  _Bool _Var2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  bool local_51;
  long local_50;
  
  local_51 = cont->n_runs < 1;
  if (0 < cont->n_runs) {
    local_50 = 0;
    do {
      uVar1 = cont->runs[local_50].value;
      uVar3 = (ulong)cont->runs[local_50].length;
      _Var2 = (*iterator)(base + uVar1 | high_bits,ptr);
      if (!_Var2) {
        return local_51;
      }
      uVar5 = (uint)uVar1 + base + 1;
      lVar4 = 1;
      do {
        if (lVar4 + uVar3 == 1) goto LAB_001194da;
        _Var2 = (*iterator)(uVar5 | high_bits,ptr);
        lVar4 = lVar4 + -1;
        uVar5 = uVar5 + 1;
      } while (_Var2);
      if ((ulong)-lVar4 < uVar3) {
        return local_51;
      }
LAB_001194da:
      local_50 = local_50 + 1;
      local_51 = cont->n_runs <= local_50;
    } while (local_50 < cont->n_runs);
  }
  return local_51;
}

Assistant:

bool run_container_iterate64(const run_container_t *cont, uint32_t base,
                             roaring_iterator64 iterator, uint64_t high_bits,
                             void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(high_bits | (uint64_t)(run_start + j), ptr))
                return false;
    }
    return true;
}